

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeDoubletonWithConstantOnRight
          (OptimizeInstructions *this,Binary *curr)

{
  Expression *expr;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_02;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_03;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_04;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_05;
  Binary *pBVar1;
  bool bVar2;
  bool bVar3;
  BinaryOp BVar4;
  uint uVar5;
  BinaryOp BVar6;
  Index IVar7;
  BinaryOp BVar8;
  Index IVar9;
  Module *wasm;
  Block *pBVar10;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar11;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R9;
  optional<wasm::Type> type_00;
  bool local_bd9;
  Literal local_a90;
  Index local_a74;
  undefined1 local_a70 [4];
  Index diff;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_a30;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_9f0 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_9e0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_9b8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_990;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_950;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_910 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_900;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_8d8;
  Const *local_8b0;
  Const *c2_5;
  Const *c1_5;
  Binary *inner_5;
  Type local_890;
  Literal local_888;
  Type local_870;
  Literal local_868;
  BasicType local_84c;
  Type local_848;
  Type type_2;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_800;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_7c0 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_7b0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_788;
  Const *local_760;
  Const *c2_4;
  Const *c1_4;
  Binary *inner_4;
  Type local_740;
  Literal local_738;
  Type local_720;
  Literal local_718;
  BasicType local_6fc;
  Type local_6f8;
  Type type_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_6e0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_6a0;
  Binary *local_660 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_650;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_618;
  Const *local_5f0;
  Const *c2_3;
  Const *c1_3;
  Binary *inner_3;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_5c0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_580;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_540 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_530;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_508;
  Const *local_4e0;
  Const *c2_2;
  Const *c1_2;
  Binary *inner_2;
  uintptr_t local_4b0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_4a8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_468;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_428 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_418;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_3f0;
  Const *local_3c8;
  Const *c2_1;
  Const *c1_1;
  Binary *inner_1;
  Literal local_3a8;
  uintptr_t local_390;
  optional<wasm::Type> local_380;
  Drop *local_370;
  Const *local_368;
  initializer_list<wasm::Expression_*> local_360;
  Builder local_350;
  Builder builder;
  Literal local_1e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  Expression *x;
  uintptr_t local_1b8;
  uintptr_t local_1b0;
  Literal local_1a8;
  uintptr_t local_190;
  Literal local_188;
  uintptr_t local_170;
  Index local_168;
  Index local_164;
  Index effectiveTotal;
  Index total;
  uintptr_t local_148;
  Literal local_140;
  uintptr_t local_128;
  Literal local_120;
  uintptr_t local_108;
  Literal local_f0;
  uintptr_t local_d8;
  BinaryOp local_cc;
  Type TStack_c8;
  BinaryOp op;
  Type type;
  Binary *local_80 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_70;
  Const *local_38;
  Const *c2;
  Const *c1;
  Binary *inner;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  inner = curr;
  curr_local = (Binary *)this;
  local_38 = Expression::cast<wasm::Const>(curr->right);
  expr = inner->left;
  local_80[0] = (Binary *)Match::any();
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)&type,&c2);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_70,(Match *)&c1,local_80,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&type,in_R8);
  matcher_05._8_8_ = local_70._8_8_;
  matcher_05.binder = local_70.binder;
  matcher_05.submatchers.curr.binder = local_70.submatchers.curr.binder;
  matcher_05.submatchers.curr._8_8_ = local_70.submatchers.curr._8_8_;
  matcher_05.submatchers.next.curr = local_70.submatchers.next.curr;
  matcher_05.submatchers.next.next.curr = local_70.submatchers.next.next.curr;
  matcher_05.submatchers.next.next._8_8_ = local_70.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    (expr,matcher_05);
  bVar3 = false;
  if (bVar2) {
    bVar3 = (c1->value).field_0.i32 == inner->op;
  }
  if (bVar3) {
    local_d8 = (c1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    BVar8 = (c1->value).field_0.i32;
    local_cc = BVar8;
    TStack_c8.id = local_d8;
    BVar4 = Abstract::getBinary((Type)local_d8,And);
    BVar6 = local_cc;
    if (BVar8 == BVar4) {
      wasm::Literal::and_(&local_f0,&c2->value,&local_38->value);
      wasm::Literal::operator=(&c2->value,&local_f0);
      wasm::Literal::~Literal(&local_f0);
      return (Expression *)c1;
    }
    local_108 = TStack_c8.id;
    BVar4 = Abstract::getBinary(TStack_c8,Or);
    BVar8 = local_cc;
    if (BVar6 == BVar4) {
      wasm::Literal::or_(&local_120,&c2->value,&local_38->value);
      wasm::Literal::operator=(&c2->value,&local_120);
      wasm::Literal::~Literal(&local_120);
      return (Expression *)c1;
    }
    local_128 = TStack_c8.id;
    BVar4 = Abstract::getBinary(TStack_c8,Xor);
    BVar6 = local_cc;
    if (BVar8 == BVar4) {
      wasm::Literal::xor_(&local_140,&c2->value,&local_38->value);
      wasm::Literal::operator=(&c2->value,&local_140);
      wasm::Literal::~Literal(&local_140);
      return (Expression *)c1;
    }
    local_148 = TStack_c8.id;
    BVar8 = Abstract::getBinary(TStack_c8,Mul);
    if (BVar6 == BVar8) {
      wasm::Literal::mul((Literal *)&effectiveTotal,&c2->value,&local_38->value);
      wasm::Literal::operator=(&c2->value,(Literal *)&effectiveTotal);
      wasm::Literal::~Literal((Literal *)&effectiveTotal);
      return (Expression *)c1;
    }
    bVar3 = Abstract::hasAnyShift(local_cc);
    if (bVar3) {
      IVar9 = Bits::getEffectiveShifts((Expression *)c2);
      local_164 = Bits::getEffectiveShifts((Expression *)local_38);
      local_164 = IVar9 + local_164;
      local_170 = (c2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
      local_168 = Bits::getEffectiveShifts(local_164,(Type)local_170);
      if (local_164 == local_168) {
        local_190 = (c2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                    id;
        wasm::Literal::makeFromInt32(&local_188,local_164,(Type)local_190);
        wasm::Literal::operator=(&c2->value,&local_188);
        wasm::Literal::~Literal(&local_188);
        return (Expression *)c1;
      }
      bVar3 = Abstract::hasAnyRotateShift(local_cc);
      BVar8 = local_cc;
      if (bVar3) {
        local_1b0 = (c2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                    id;
        wasm::Literal::makeFromInt32(&local_1a8,local_168,(Type)local_1b0);
        wasm::Literal::operator=(&c2->value,&local_1a8);
        wasm::Literal::~Literal(&local_1a8);
        return (Expression *)c1;
      }
      local_1b8 = TStack_c8.id;
      BVar4 = Abstract::getBinary(TStack_c8,Shl);
      BVar6 = local_cc;
      if (BVar8 == BVar4) {
LAB_01f884fd:
        local_1c8 = (c1->value).field_0.gcData.
                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        wasm::Literal::makeZero
                  (&local_1e0,
                   (Type)(c2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                         type.id);
        wasm::Literal::operator=(&c2->value,&local_1e0);
        wasm::Literal::~Literal(&local_1e0);
        effects((EffectAnalyzer *)&builder,this,(Expression *)local_1c8);
        bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&builder);
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&builder);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
          Builder::Builder(&local_350,wasm);
          local_370 = Builder::makeDrop(&local_350,(Expression *)local_1c8);
          local_368 = c2;
          local_360._M_array = (iterator)&local_370;
          local_360._M_len = 2;
          std::optional<wasm::Type>::optional(&local_380);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_380.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_380.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          pBVar10 = Builder::makeBlock(&local_350,&local_360,type_00);
          return (Expression *)pBVar10;
        }
        return (Expression *)c2;
      }
      x = (Expression *)TStack_c8.id;
      BVar4 = Abstract::getBinary(TStack_c8,ShrU);
      BVar8 = local_cc;
      if (BVar6 == BVar4) goto LAB_01f884fd;
      local_390 = TStack_c8.id;
      BVar6 = Abstract::getBinary(TStack_c8,ShrS);
      if (BVar8 == BVar6) {
        uVar5 = wasm::Type::getByteSize
                          (&(c2->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type);
        inner_1 = (Binary *)
                  (c2->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
        wasm::Literal::makeFromInt32(&local_3a8,uVar5 * 8 + -1,(Type)inner_1);
        wasm::Literal::operator=(&c2->value,&local_3a8);
        wasm::Literal::~Literal(&local_3a8);
        return (Expression *)c1;
      }
    }
  }
  pBVar1 = inner;
  local_428[0] = Match::any();
  Match::ival(&local_468,&c2_1);
  pMVar11 = &local_468;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_418,(Match *)&c1_1,(Binary **)0xa,(Op)local_428,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar11,in_R9);
  Match::ival(&local_4a8,&local_3c8);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_3f0,(Match *)0x5,(Op)&local_418,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&local_4a8,pMVar11);
  matcher.data = local_3f0.data;
  matcher._12_4_ = local_3f0._12_4_;
  matcher.binder = local_3f0.binder;
  matcher.submatchers.curr = local_3f0.submatchers.curr;
  matcher.submatchers.next.curr = local_3f0.submatchers.next.curr;
  matcher.submatchers.next._8_8_ = local_3f0.submatchers.next._8_8_;
  bVar3 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)pBVar1,matcher);
  pBVar1 = inner;
  if (bVar3) {
    local_4b0 = (c1_1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    BVar8 = Abstract::getBinary((Type)local_4b0,Mul);
    (c1_1->value).field_0.i32 = BVar8;
    wasm::Literal::shl((Literal *)&inner_2,&local_3c8->value,&c2_1->value);
    wasm::Literal::operator=(&c2_1->value,(Literal *)&inner_2);
    wasm::Literal::~Literal((Literal *)&inner_2);
    return (Expression *)c1_1;
  }
  local_540[0] = Match::any();
  Match::ival(&local_580,&c2_2);
  pMVar11 = &local_580;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_530,(Match *)&c1_2,(Binary **)0x5,(Op)local_540,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar11,in_R9);
  Match::ival(&local_5c0,&local_4e0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_508,(Match *)0xa,(Op)&local_530,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&local_5c0,pMVar11);
  matcher_00.data = local_508.data;
  matcher_00._12_4_ = local_508._12_4_;
  matcher_00.binder = local_508.binder;
  matcher_00.submatchers.curr = local_508.submatchers.curr;
  matcher_00.submatchers.next.curr = local_508.submatchers.next.curr;
  matcher_00.submatchers.next._8_8_ = local_508.submatchers.next._8_8_;
  bVar3 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)pBVar1,matcher_00);
  pBVar1 = inner;
  if (bVar3) {
    wasm::Literal::shl((Literal *)&inner_3,&c2_2->value,&local_4e0->value);
    wasm::Literal::operator=(&c2_2->value,(Literal *)&inner_3);
    wasm::Literal::~Literal((Literal *)&inner_3);
    return (Expression *)c1_2;
  }
  local_660[0] = (Binary *)Match::any();
  Match::ival(&local_6a0,&c2_3);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_650,(Match *)&c1_3,local_660,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_6a0,pMVar11);
  Match::ival(&local_6e0,&local_5f0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_618,(Match *)0xa,(Op)&local_650,
             (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&local_6e0,pMVar11);
  matcher_01.data = local_618.data;
  matcher_01._12_4_ = local_618._12_4_;
  matcher_01.binder = local_618.binder;
  matcher_01.submatchers.curr = local_618.submatchers.curr;
  matcher_01.submatchers.next.curr = local_618.submatchers.next.curr;
  matcher_01.submatchers.next._8_8_ = local_618.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)pBVar1,matcher_01);
  bVar3 = false;
  if (bVar2) {
    BVar8 = (c1_3->value).field_0.i32;
    BVar6 = Abstract::getBinary((Type)(c1_3->super_SpecificExpression<(wasm::Expression::Id)14>).
                                      super_Expression.type.id,ShrS);
    if (BVar8 != BVar6) {
      BVar8 = (c1_3->value).field_0.i32;
      type_1.id = (c1_3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                  id;
      BVar6 = Abstract::getBinary(type_1,ShrU);
      bVar3 = false;
      if (BVar8 != BVar6) goto LAB_01f88b88;
    }
    IVar9 = Bits::getEffectiveShifts((Expression *)c2_3);
    IVar7 = Bits::getEffectiveShifts((Expression *)local_5f0);
    bVar3 = IVar9 == IVar7;
  }
LAB_01f88b88:
  pBVar1 = inner;
  if (bVar3) {
    local_6f8.id = (c2_3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                   id;
    local_6fc = i32;
    bVar3 = wasm::Type::operator==(&local_6f8,&local_6fc);
    if (bVar3) {
      IVar9 = Bits::getEffectiveShifts((Expression *)c2_3);
      wasm::Type::Type(&local_720,i32);
      wasm::Literal::makeFromInt32(&local_718,-(1 << ((byte)IVar9 & 0x1f)),local_720);
      wasm::Literal::operator=(&c2_3->value,&local_718);
      wasm::Literal::~Literal(&local_718);
    }
    else {
      IVar9 = Bits::getEffectiveShifts((Expression *)c2_3);
      wasm::Type::Type(&local_740,i64);
      wasm::Literal::makeFromInt64(&local_738,-(1L << ((byte)IVar9 & 0x3f)),local_740);
      wasm::Literal::operator=(&c2_3->value,&local_738);
      wasm::Literal::~Literal(&local_738);
    }
    inner_4 = (Binary *)local_6f8.id;
    BVar8 = Abstract::getBinary(local_6f8,And);
    (c1_3->value).field_0.i32 = BVar8;
    this_local = (OptimizeInstructions *)c1_3;
  }
  else {
    local_7c0[0] = Match::any();
    Match::ival(&local_800,&c2_4);
    pMVar11 = &local_800;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_7b0,(Match *)&c1_4,(Binary **)0xa,(Op)local_7c0,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar11,in_R9);
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                 *)&type_2,&local_760);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_788,(Match *)0xb,(Op)&local_7b0,
               (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)&type_2,pMVar11);
    matcher_02.data = local_788.data;
    matcher_02._12_4_ = local_788._12_4_;
    matcher_02.binder = local_788.binder;
    matcher_02.submatchers.curr = local_788.submatchers.curr;
    matcher_02.submatchers.next.curr = local_788.submatchers.next.curr;
    matcher_02.submatchers.next._8_8_ = local_788.submatchers.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      ((Expression *)pBVar1,matcher_02);
    bVar3 = false;
    if (bVar2) {
      IVar9 = Bits::getEffectiveShifts((Expression *)c2_4);
      IVar7 = Bits::getEffectiveShifts((Expression *)local_760);
      bVar3 = IVar9 == IVar7;
    }
    pBVar1 = inner;
    if (bVar3) {
      local_848.id = (c2_4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                     type.id;
      local_84c = i32;
      bVar3 = wasm::Type::operator==(&local_848,&local_84c);
      if (bVar3) {
        IVar9 = Bits::getEffectiveShifts((Expression *)c2_4);
        wasm::Type::Type(&local_870,i32);
        wasm::Literal::makeFromInt32(&local_868,0xffffffff >> ((byte)IVar9 & 0x1f),local_870);
        wasm::Literal::operator=(&c2_4->value,&local_868);
        wasm::Literal::~Literal(&local_868);
      }
      else {
        IVar9 = Bits::getEffectiveShifts((Expression *)c2_4);
        wasm::Type::Type(&local_890,i64);
        wasm::Literal::makeFromInt64
                  (&local_888,0xffffffffffffffff >> ((byte)IVar9 & 0x3f),local_890);
        wasm::Literal::operator=(&c2_4->value,&local_888);
        wasm::Literal::~Literal(&local_888);
      }
      inner_5 = (Binary *)local_848.id;
      BVar8 = Abstract::getBinary(local_848,And);
      (c1_4->value).field_0.i32 = BVar8;
      this_local = (OptimizeInstructions *)c1_4;
    }
    else {
      local_910[0] = Match::any();
      Match::ival(&local_950,&c2_5);
      pMVar11 = &local_950;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_900,(Match *)&c1_5,(Binary **)0xe,(Op)local_910,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar11,in_R9);
      Match::ival(&local_990,&local_8b0);
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_8d8,(Match *)0xd,(Op)&local_900,
                 (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                  *)&local_990,pMVar11);
      matcher_03.data = local_8d8.data;
      matcher_03._12_4_ = local_8d8._12_4_;
      matcher_03.binder = local_8d8.binder;
      matcher_03.submatchers.curr = local_8d8.submatchers.curr;
      matcher_03.submatchers.next.curr = local_8d8.submatchers.next.curr;
      matcher_03.submatchers.next._8_8_ = local_8d8.submatchers.next._8_8_;
      bVar3 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        ((Expression *)pBVar1,matcher_03);
      pBVar1 = inner;
      local_bd9 = true;
      if (!bVar3) {
        local_9f0[0] = Match::any();
        Match::ival(&local_a30,&c2_5);
        pMVar11 = &local_a30;
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                  (&local_9e0,(Match *)&c1_5,(Binary **)0xd,(Op)local_9f0,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar11,in_R9);
        Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                     *)local_a70,&local_8b0);
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                  (&local_9b8,(Match *)0xe,(Op)&local_9e0,
                   (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    *)local_a70,pMVar11);
        matcher_04.data = local_9b8.data;
        matcher_04._12_4_ = local_9b8._12_4_;
        matcher_04.binder = local_9b8.binder;
        matcher_04.submatchers.curr = local_9b8.submatchers.curr;
        matcher_04.submatchers.next.curr = local_9b8.submatchers.next.curr;
        matcher_04.submatchers.next._8_8_ = local_9b8.submatchers.next._8_8_;
        local_bd9 = Match::
                    matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                              ((Expression *)pBVar1,matcher_04);
      }
      if (local_bd9 == false) {
        this_local = (OptimizeInstructions *)0x0;
      }
      else {
        IVar9 = Bits::getEffectiveShifts((Expression *)c2_5);
        local_a74 = Bits::getEffectiveShifts((Expression *)local_8b0);
        local_a74 = IVar9 - local_a74;
        IVar9 = Bits::getEffectiveShifts
                          (local_a74,
                           (Type)(local_8b0->super_SpecificExpression<(wasm::Expression::Id)14>).
                                 super_Expression.type.id);
        wasm::Literal::makeFromInt32
                  (&local_a90,IVar9,
                   (Type)(local_8b0->super_SpecificExpression<(wasm::Expression::Id)14>).
                         super_Expression.type.id);
        wasm::Literal::operator=(&c2_5->value,&local_a90);
        wasm::Literal::~Literal(&local_a90);
        this_local = (OptimizeInstructions *)c1_5;
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeDoubletonWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    {
      Binary* inner;
      Const *c1, *c2 = curr->right->cast<Const>();
      if (matches(curr->left, binary(&inner, any(), ival(&c1))) &&
          inner->op == curr->op) {
        Type type = inner->type;
        BinaryOp op = inner->op;
        // (x & C1) & C2   =>   x & (C1 & C2)
        if (op == getBinary(type, And)) {
          c1->value = c1->value.and_(c2->value);
          return inner;
        }
        // (x | C1) | C2   =>   x | (C1 | C2)
        if (op == getBinary(type, Or)) {
          c1->value = c1->value.or_(c2->value);
          return inner;
        }
        // (x ^ C1) ^ C2   =>   x ^ (C1 ^ C2)
        if (op == getBinary(type, Xor)) {
          c1->value = c1->value.xor_(c2->value);
          return inner;
        }
        // (x * C1) * C2   =>   x * (C1 * C2)
        if (op == getBinary(type, Mul)) {
          c1->value = c1->value.mul(c2->value);
          return inner;
        }
        // TODO:
        // handle signed / unsigned divisions. They are more complex

        // (x <<>> C1) <<>> C2   =>   x <<>> (C1 + C2)
        if (hasAnyShift(op)) {
          // shifts only use an effective amount from the constant, so
          // adding must be done carefully
          auto total =
            Bits::getEffectiveShifts(c1) + Bits::getEffectiveShifts(c2);
          auto effectiveTotal = Bits::getEffectiveShifts(total, c1->type);
          if (total == effectiveTotal) {
            // no overflow, we can do this
            c1->value = Literal::makeFromInt32(total, c1->type);
            return inner;
          } else {
            // overflow. Handle different scenarious
            if (hasAnyRotateShift(op)) {
              // overflow always accepted in rotation shifts
              c1->value = Literal::makeFromInt32(effectiveTotal, c1->type);
              return inner;
            }
            // handle overflows for general shifts
            //   x << C1 << C2    =>   0 or { drop(x), 0 }
            //   x >>> C1 >>> C2  =>   0 or { drop(x), 0 }
            // iff `C1 + C2` -> overflows
            if ((op == getBinary(type, Shl) || op == getBinary(type, ShrU))) {
              auto* x = inner->left;
              c1->value = Literal::makeZero(c1->type);
              if (!effects(x).hasSideEffects()) {
                //  =>  0
                return c1;
              } else {
                //  =>  { drop(x), 0 }
                Builder builder(*getModule());
                return builder.makeBlock({builder.makeDrop(x), c1});
              }
            }
            //   i32(x) >> C1 >> C2   =>   x >> 31
            //   i64(x) >> C1 >> C2   =>   x >> 63
            // iff `C1 + C2` -> overflows
            if (op == getBinary(type, ShrS)) {
              c1->value = Literal::makeFromInt32(c1->type.getByteSize() * 8 - 1,
                                                 c1->type);
              return inner;
            }
          }
        }
      }
    }
    {
      // (x << C1) * C2   =>   x * (C2 << C1)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Mul, binary(&inner, Shl, any(), ival(&c1)), ival(&c2)))) {
        inner->op = getBinary(inner->type, Mul);
        c1->value = c2->value.shl(c1->value);
        return inner;
      }
    }
    {
      // (x * C1) << C2   =>   x * (C1 << C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Shl, binary(&inner, Mul, any(), ival(&c1)), ival(&c2)))) {
        c1->value = c1->value.shl(c2->value);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x >> C)  << C   =>   x & -(1 << C)
      // (x >>> C) << C   =>   x & -(1 << C)
      Binary* inner;
      Const *c1, *c2;
      if (matches(curr,
                  binary(Shl, binary(&inner, any(), ival(&c1)), ival(&c2))) &&
          (inner->op == getBinary(inner->type, ShrS) ||
           inner->op == getBinary(inner->type, ShrU)) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -(1U << Bits::getEffectiveShifts(c1)), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -(1ULL << Bits::getEffectiveShifts(c1)), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x << C) >>> C   =>   x & (-1 >>> C)
      // (x << C) >> C    =>   skip
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(ShrU, binary(&inner, Shl, any(), ival(&c1)), ival(&c2))) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -1U >> Bits::getEffectiveShifts(c1), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -1ULL >> Bits::getEffectiveShifts(c1), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add canonicalization rotr to rotl and remove these rules.
      // rotl(rotr(x, C1), C2)   =>   rotr(x, C1 - C2)
      // rotr(rotl(x, C1), C2)   =>   rotl(x, C1 - C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(RotL, binary(&inner, RotR, any(), ival(&c1)), ival(&c2))) ||
          matches(
            curr,
            binary(RotR, binary(&inner, RotL, any(), ival(&c1)), ival(&c2)))) {
        auto diff = Bits::getEffectiveShifts(c1) - Bits::getEffectiveShifts(c2);
        c1->value = Literal::makeFromInt32(
          Bits::getEffectiveShifts(diff, c2->type), c2->type);
        return inner;
      }
    }
    return nullptr;
  }